

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O2

uint64_t ar_atol10(char *p,uint char_cnt)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  pcVar1 = p + char_cnt;
  while( true ) {
    if ((*p != ' ') && (*p != '\t')) goto LAB_0014c3aa;
    bVar6 = char_cnt == 0;
    char_cnt = char_cnt - 1;
    if (bVar6) break;
    p = p + 1;
  }
  char_cnt = 0xffffffff;
  p = pcVar1;
LAB_0014c3aa:
  lVar4 = 0;
  for (uVar2 = 0;
      (((uVar3 = uVar2, 0x2f < p[lVar4] && (uVar5 = (int)p[lVar4] - 0x30, uVar5 < 10)) &&
       (char_cnt != (uint)lVar4)) &&
      ((uVar3 = 0xffffffffffffffff, uVar2 < 0x199999999999999a &&
       (uVar2 != 0x1999999999999999 || uVar5 < 6)))); uVar2 = (ulong)uVar5 + uVar2 * 10) {
    lVar4 = lVar4 + 1;
  }
  return uVar3;
}

Assistant:

static uint64_t
ar_atol10(const char *p, unsigned char_cnt)
{
	uint64_t l, limit, last_digit_limit;
	unsigned int base, digit;

	base = 10;
	limit = UINT64_MAX / base;
	last_digit_limit = UINT64_MAX % base;

	while ((*p == ' ' || *p == '\t') && char_cnt-- > 0)
		p++;
	l = 0;
	digit = *p - '0';
	while (*p >= '0' && digit < base  && char_cnt-- > 0) {
		if (l > limit || (l == limit && digit > last_digit_limit)) {
			l = UINT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++p - '0';
	}
	return (l);
}